

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

Var Js::JavascriptConversion::OrdinaryToPrimitive<(Js::JavascriptHint)1>
              (RecyclableObject *value,ScriptContext *requestContext)

{
  ScriptContext *checkScriptContext;
  int iVar1;
  Type *pTVar2;
  Type local_28;
  Var result;
  
  pTVar2 = &local_28;
  iVar1 = (*(value->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2c])(value,1,pTVar2);
  if (iVar1 == 0) {
    checkScriptContext =
         (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
         .ptr;
    JavascriptError::TryThrowTypeError
              (checkScriptContext,checkScriptContext,-0x7ff5ec73,(PCWSTR)0x0);
    pTVar2 = &(((requestContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).nullValue;
  }
  return pTVar2->ptr;
}

Assistant:

Var JavascriptConversion::OrdinaryToPrimitive(_In_ RecyclableObject* value, _In_ ScriptContext* requestContext)
    {
        Var result;
        if (!value->ToPrimitive(hint, &result, requestContext))
        {
            ScriptContext *const scriptContext = value->GetScriptContext();

            int32 hCode;

            switch (hint)
            {
            case JavascriptHint::HintNumber:
                hCode = JSERR_NeedNumber;
                break;
            case JavascriptHint::HintString:
                hCode = JSERR_NeedString;
                break;
            default:
                hCode = VBSERR_OLENoPropOrMethod;
                break;
            }
            JavascriptError::TryThrowTypeError(scriptContext, scriptContext, hCode);
            return requestContext->GetLibrary()->GetNull();
        }
        return result;
    }